

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O1

int __thiscall CS248::OSDText::init(OSDText *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type __n;
  int iVar2;
  GLuint GVar3;
  GLint GVar4;
  long *plVar5;
  char *pcVar6;
  size_t sVar7;
  long *plVar8;
  size_type *psVar9;
  OSDText *this_00;
  EVP_PKEY_CTX *pEVar10;
  string decoded;
  string encoded;
  string local_d0;
  string local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->use_hdpi = SUB81(ctx,0);
  iVar2 = FT_Init_FreeType(this->ft);
  if (iVar2 == 0) {
    std::operator+(&local_50,&osdfont_base64_1_abi_cxx11_,&osdfont_base64_2_abi_cxx11_);
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_50,
                                (ulong)osdfont_base64_3_abi_cxx11_._M_dataplus._M_p);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_80 = *plVar8;
      lStack_78 = plVar5[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar8;
      local_90 = (long *)*plVar5;
    }
    local_88 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,
                                (ulong)osdfont_base64_4_abi_cxx11_._M_dataplus._M_p);
    plVar8 = plVar5 + 2;
    if ((long *)*plVar5 == plVar8) {
      local_60 = *plVar8;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar8;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,
                                (ulong)osdfont_base64_5_abi_cxx11_._M_dataplus._M_p);
    paVar1 = &local_d0.field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0.field_2._8_8_ = plVar5[3];
      local_d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_d0,
                                (ulong)osdfont_base64_6_abi_cxx11_._M_dataplus._M_p);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0.field_2._8_8_ = plVar5[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar9;
      local_b0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_b0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    base64_decode(&local_d0,&local_b0);
    __n = local_d0._M_string_length;
    pcVar6 = (char *)operator_new__(local_d0._M_string_length);
    this->font = pcVar6;
    memcpy(pcVar6,local_d0._M_dataplus._M_p,__n);
    this_00 = (OSDText *)*this->ft;
    iVar2 = FT_New_Memory_Face(this_00,pcVar6,__n,0,this->face);
    if (iVar2 == 0) {
      GVar3 = compile_shaders(this_00);
      this->program = GVar3;
      iVar2 = -1;
      if (GVar3 != 0) {
        pEVar10 = (EVP_PKEY_CTX *)(ulong)GVar3;
        GVar4 = (*__glewGetAttribLocation)(GVar3,"coord");
        if (GVar4 == -1) {
          init(pEVar10);
        }
        this->attribute_coord = GVar4;
        pEVar10 = (EVP_PKEY_CTX *)(ulong)this->program;
        GVar4 = (*__glewGetUniformLocation)(this->program,"tex");
        if (GVar4 == -1) {
          init(pEVar10);
        }
        this->uniform_tex = GVar4;
        pEVar10 = (EVP_PKEY_CTX *)(ulong)this->program;
        GVar4 = (*__glewGetUniformLocation)(this->program,"color");
        if (GVar4 == -1) {
          init(pEVar10);
        }
        this->uniform_color = GVar4;
        if (((GVar4 != -1) && (this->attribute_coord != -1)) && (this->uniform_tex != -1)) {
          (*__glewGenBuffers)(1,&this->vbo);
          iVar2 = 0;
          (*__glewGenVertexArrays)(1,&this->vertexAttribArray);
        }
      }
    }
    else {
      pcVar6 = this->font;
      if (pcVar6 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x24baf0);
      }
      else {
        sVar7 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[31m",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[CS248] ",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0m",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Cannot open font",0x10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
      iVar2 = -1;
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[31m",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[CS248] ",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Cannot init freetype library",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    std::ostream::flush();
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int OSDText::init(bool use_hdpi) {

    this->use_hdpi = use_hdpi;

    // initialize font library
    if (FT_Init_FreeType(ft)) {
      out_err("Cannot init freetype library");
      return -1;
    }

    // decode font and keep in memory
    string encoded = osdfont_base64_1 + osdfont_base64_2 + osdfont_base64_3 
                      + osdfont_base64_4 + osdfont_base64_5 + osdfont_base64_6;
    string decoded = base64_decode(encoded);
    size_t size = decoded.size();
    font = new char[size];
    memcpy(font, decoded.c_str(), size);

    // initialize font face
    if (FT_New_Memory_Face(*ft, (const FT_Byte*) font, size, 0, face)) {
        cerr << font;
        out_err("Cannot open font");
        return -1;
    }

    // compile shaders
    program = compile_shaders();
    if (program) {
        attribute_coord = get_attribu ( program, "coord" );
        uniform_tex     = get_uniform ( program, "tex"   );
        uniform_color   = get_uniform ( program, "color" );
        if (attribute_coord == -1 || uniform_tex == -1 || uniform_color == -1) {
            return -1;
        }
    } else return -1;

    // create the vbo
    glGenBuffers(1, &vbo);

    // vertex array
    glGenVertexArrays(1, &vertexAttribArray);

    return 0;
}